

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::ReleaseInterpreterArena(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocator *arenaAllocator;
  
  arenaAllocator = this->interpreterArena;
  if (arenaAllocator == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xac2,"(this->interpreterArena)","No interpreter arena to release")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    arenaAllocator = this->interpreterArena;
    if (arenaAllocator == (ArenaAllocator *)0x0) {
      return;
    }
  }
  Memory::Recycler::DeleteGuestArena(this->recycler,arenaAllocator);
  this->interpreterArena = (ArenaAllocator *)0x0;
  return;
}

Assistant:

void ScriptContext::ReleaseInterpreterArena()
    {
        AssertMsg(this->interpreterArena, "No interpreter arena to release");
        if (this->interpreterArena)
        {
            this->GetRecycler()->DeleteGuestArena(this->interpreterArena);
            this->interpreterArena = nullptr;
        }
    }